

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int jitopt_param(jit_State *J,char *str)

{
  bool bVar1;
  int iVar2;
  ulong __n;
  char *in_RSI;
  long in_RDI;
  char *p;
  int32_t n;
  size_t len;
  int i;
  char *lst;
  char *local_40;
  int local_34;
  int local_24;
  byte *local_20;
  
  local_20 = (byte *)0x1a7588;
  local_24 = 0;
  while( true ) {
    if (0xd < local_24) {
      return 0;
    }
    __n = (ulong)*local_20;
    iVar2 = strncmp(in_RSI,(char *)(local_20 + 1),__n);
    if ((iVar2 == 0) && (in_RSI[__n] == '=')) break;
    local_20 = local_20 + __n + 1;
    local_24 = local_24 + 1;
  }
  local_34 = 0;
  local_40 = in_RSI + __n + 1;
  while( true ) {
    bVar1 = false;
    if ('/' < *local_40) {
      bVar1 = *local_40 < ':';
    }
    if (!bVar1) break;
    local_34 = local_34 * 10 + *local_40 + -0x30;
    local_40 = local_40 + 1;
  }
  if (*local_40 != '\0') {
    return 0;
  }
  *(int *)(in_RDI + 0x5f8 + (long)local_24 * 4) = local_34;
  if (local_24 == 5) {
    lj_dispatch_init_hotcount((global_State *)(in_RDI + -0x198));
  }
  return 1;
}

Assistant:

static int jitopt_param(jit_State *J, const char *str)
{
  const char *lst = JIT_P_STRING;
  int i;
  for (i = 0; i < JIT_P__MAX; i++) {
    size_t len = *(const uint8_t *)lst;
    lua_assert(len != 0);
    if (strncmp(str, lst+1, len) == 0 && str[len] == '=') {
      int32_t n = 0;
      const char *p = &str[len+1];
      while (*p >= '0' && *p <= '9')
	n = n*10 + (*p++ - '0');
      if (*p) return 0;  /* Malformed number. */
      J->param[i] = n;
      if (i == JIT_P_hotloop)
	lj_dispatch_init_hotcount(J2G(J));
      return 1;  /* Ok. */
    }
    lst += 1+len;
  }
  return 0;  /* No match. */
}